

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderResult
duckdb_brotli::BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer)

{
  int iVar1;
  brotli_free_func in_RCX;
  undefined8 *in_RDX;
  BrotliDecoderStateInternal *in_RSI;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t total_out;
  BrotliDecoderResult result;
  BrotliDecoderStateInternal s;
  undefined4 local_169c;
  size_t *in_stack_ffffffffffffea70;
  uint8_t **in_stack_ffffffffffffea78;
  size_t *in_stack_ffffffffffffea80;
  uint8_t **in_stack_ffffffffffffea88;
  size_t *in_stack_ffffffffffffea90;
  BrotliDecoderStateInternal *in_stack_ffffffffffffea98;
  undefined4 local_4;
  
  iVar1 = BrotliDecoderStateInit(in_RSI,(brotli_alloc_func)*in_RDX,in_RCX,(void *)0x82b5fa);
  if (iVar1 == 0) {
    local_4 = BROTLI_DECODER_RESULT_ERROR;
  }
  else {
    local_169c = BrotliDecoderDecompressStream
                           (in_stack_ffffffffffffea98,in_stack_ffffffffffffea90,
                            in_stack_ffffffffffffea88,in_stack_ffffffffffffea80,
                            in_stack_ffffffffffffea78,in_stack_ffffffffffffea70);
    *in_RDX = 0;
    BrotliDecoderStateCleanup((BrotliDecoderStateInternal *)0x82b64b);
    if (local_169c != BROTLI_DECODER_RESULT_SUCCESS) {
      local_169c = BROTLI_DECODER_RESULT_ERROR;
    }
    local_4 = local_169c;
  }
  return local_4;
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(size_t encoded_size,
                                            const uint8_t encoded_buffer[BROTLI_ARRAY_PARAM(encoded_size)],
                                            size_t *decoded_size,
                                            uint8_t decoded_buffer[BROTLI_ARRAY_PARAM(*decoded_size)]) {
	BrotliDecoderState s;
	BrotliDecoderResult result;
	size_t total_out = 0;
	size_t available_in = encoded_size;
	const uint8_t *next_in = encoded_buffer;
	size_t available_out = *decoded_size;
	uint8_t *next_out = decoded_buffer;
	if (!BrotliDecoderStateInit(&s, 0, 0, 0)) {
		return BROTLI_DECODER_RESULT_ERROR;
	}
	result = BrotliDecoderDecompressStream(&s, &available_in, &next_in, &available_out, &next_out, &total_out);
	*decoded_size = total_out;
	BrotliDecoderStateCleanup(&s);
	if (result != BROTLI_DECODER_RESULT_SUCCESS) {
		result = BROTLI_DECODER_RESULT_ERROR;
	}
	return result;
}